

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_SectionContributionStream.h
# Opt level: O0

void __thiscall
PDB::SectionContributionStream::~SectionContributionStream(SectionContributionStream *this)

{
  SectionContributionStream *this_local;
  
  CoalescedMSFStream::~CoalescedMSFStream(&this->m_stream);
  return;
}

Assistant:

class PDB_NO_DISCARD SectionContributionStream
	{
	public:
		SectionContributionStream(void) PDB_NO_EXCEPT;
		explicit SectionContributionStream(const DirectMSFStream& directStream, uint32_t size, uint32_t offset) PDB_NO_EXCEPT;

		PDB_DEFAULT_MOVE(SectionContributionStream);

		// Returns a view of all section contributions in the stream.
		PDB_NO_DISCARD inline ArrayView<DBI::SectionContribution> GetContributions(void) const PDB_NO_EXCEPT
		{
			return ArrayView<DBI::SectionContribution>(m_contributions, m_count);
		}

	private:
		CoalescedMSFStream m_stream;
		const DBI::SectionContribution* m_contributions;
		size_t m_count;

		PDB_DISABLE_COPY(SectionContributionStream);
	}